

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_bufput_kgc(jit_State *J)

{
  IRIns s2;
  TRef TVar1;
  long lVar2;
  GCobj *o;
  
  if (((J->flags & 0x10000) != 0) && ((J->fold).right[0].field_1.o == '\x18')) {
    s2 = (J->fold).right[1];
    if (*(MSize *)((long)s2 + 0x14) != 0) {
      if ((((J->fold).left[0].field_1.o != 'V') ||
          (lVar2 = (long)(short)(J->fold).left[0].field_0.op2, lVar2 < 0)) ||
         (((J->fold).left[0].field_1.t.irt & 0x40) != 0)) goto LAB_00125099;
      o = (GCobj *)lj_buf_cat2str(J->L,(GCstr *)(J->cur).ir[lVar2 + 1],(GCstr *)s2);
      TVar1 = lj_ir_kgc(J,o,IRT_STR);
      *(short *)((long)(J->cur).ir + (ulong)(J->fold).ins.field_0.op1 * 8 + 2) = (short)TVar1;
    }
    return (TRef)(J->fold).ins.field_0.op1;
  }
LAB_00125099:
  TVar1 = lj_ir_emit(J);
  return TVar1;
}

Assistant:

LJFOLD(BUFPUT any any)
LJFOLDF(bufput_kgc)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD) && fright->o == IR_KGC) {
    GCstr *s2 = ir_kstr(fright);
    if (s2->len == 0) {  /* Empty string? */
      return LEFTFOLD;
    } else {
      if (fleft->o == IR_BUFPUT && irref_isk(fleft->op2) &&
	  !irt_isphi(fleft->t)) {  /* Join two constant string puts in a row. */
	GCstr *s1 = ir_kstr(IR(fleft->op2));
	IRRef kref = lj_ir_kstr(J, lj_buf_cat2str(J->L, s1, s2));
	/* lj_ir_kstr() may realloc the IR and invalidates any IRIns *. */
	IR(fins->op1)->op2 = kref;  /* Modify previous BUFPUT. */
	return fins->op1;
      }
    }
  }
  return EMITFOLD;  /* Always emit, CSE later. */
}